

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jmespath.hpp
# Opt level: O1

reference __thiscall
jsoncons::jmespath::detail::
jmespath_evaluator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>::
to_number_function::evaluate
          (to_number_function *this,
          vector<jsoncons::jmespath::parameter<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::parameter<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
          *args,eval_context<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
                *context,error_code *ec)

{
  pointer ppVar1;
  json_type jVar2;
  reference pbVar3;
  basic_json<char,jsoncons::sorted_policy,std::allocator<char>> *this_00;
  assertion_error *this_01;
  string_view_type sVar4;
  type tVar5;
  type tVar6;
  chars_to to_double;
  double d;
  int64_t sval;
  uint64_t uval;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> s;
  string local_78;
  type_conflict7 local_58;
  long local_50 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  ppVar1 = (args->
           super__Vector_base<jsoncons::jmespath::parameter<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::parameter<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if ((long)(args->
            super__Vector_base<jsoncons::jmespath::parameter<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::parameter<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
            )._M_impl.super__Vector_impl_data._M_finish - (long)ppVar1 >> 4 !=
      (this->
      super_function_base<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
      ).arg_count_.super__Optional_base<unsigned_long,_true,_true>._M_payload.
      super__Optional_payload_base<unsigned_long>._M_payload._M_value) {
    this_01 = (assertion_error *)__cxa_allocate_exception(0x10);
    local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_78,"assertion \'args.size() == *this->arity()\' failed at  <> :0",""
              );
    assertion_error::assertion_error(this_01,&local_78);
    __cxa_throw(this_01,&assertion_error::typeinfo,std::runtime_error::~runtime_error);
  }
  if (ppVar1->type_ == value) {
    this_00 = (basic_json<char,jsoncons::sorted_policy,std::allocator<char>> *)
              (ppVar1->field_1).value_;
    jVar2 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::type
                      ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)this_00);
    if ((1 < jVar2 - 2) && (jVar2 != double_value)) {
      if (jVar2 != string_value) goto LAB_00385584;
      sVar4 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::as_string_view
                        ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)this_00
                        );
      local_50[1] = 0;
      tVar5 = jsoncons::detail::to_integer<unsigned_long,char>
                        (sVar4._M_str,sVar4._M_len,(unsigned_long *)(local_50 + 1));
      if (tVar5.ec == success) {
        this_00 = (basic_json<char,jsoncons::sorted_policy,std::allocator<char>> *)
                  eval_context<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>
                  ::create_json<unsigned_long&>
                            ((eval_context<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>
                              *)context,(unsigned_long *)(local_50 + 1));
      }
      else {
        local_50[0] = 0;
        tVar6 = jsoncons::detail::to_integer<long,char>(sVar4._M_str,sVar4._M_len,local_50);
        if (tVar6.ec == success) {
          this_00 = (basic_json<char,jsoncons::sorted_policy,std::allocator<char>> *)
                    eval_context<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>
                    ::create_json<long&>
                              ((eval_context<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>
                                *)context,local_50);
        }
        else {
          jsoncons::detail::chars_to::chars_to((chars_to *)&local_78);
          basic_json<char,jsoncons::sorted_policy,std::allocator<char>>::
          as_string<std::allocator<char>>(&local_40,this_00,(allocator<char> *)&local_58);
          local_58 = jsoncons::detail::chars_to::operator()
                               ((chars_to *)&local_78,local_40._M_dataplus._M_p,
                                local_40._M_string_length);
          this_00 = (basic_json<char,jsoncons::sorted_policy,std::allocator<char>> *)
                    eval_context<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>
                    ::create_json<double&>
                              ((eval_context<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>
                                *)context,&local_58);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_40._M_dataplus._M_p != &local_40.field_2) {
            operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
          }
          if (local_78._M_dataplus._M_p != (pointer)0x0) {
            operator_delete(local_78._M_dataplus._M_p,
                            local_78.field_2._M_allocated_capacity - (long)local_78._M_dataplus._M_p
                           );
          }
        }
      }
    }
    return (reference)this_00;
  }
  std::error_code::operator=(ec,invalid_type);
LAB_00385584:
  pbVar3 = eval_context<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
           ::null_value(context);
  return pbVar3;
}

Assistant:

reference evaluate(const std::vector<parameter_type>& args, eval_context<Json>& context, std::error_code& ec) const override
            {
                JSONCONS_ASSERT(args.size() == *this->arity());

                if (!args[0].is_value())
                {
                    ec = jmespath_errc::invalid_type;
                    return context.null_value();
                }

                reference arg0 = args[0].value();
                switch (arg0.type())
                {
                    case json_type::int64_value:
                    case json_type::uint64_value:
                    case json_type::double_value:
                        return arg0;
                    case json_type::string_value:
                    {
                        auto sv = arg0.as_string_view();
                        uint64_t uval{ 0 };
                        auto result1 = jsoncons::detail::to_integer(sv.data(), sv.length(), uval);
                        if (result1)
                        {
                            return *context.create_json(uval);
                        }
                        int64_t sval{ 0 };
                        auto result2 = jsoncons::detail::to_integer(sv.data(), sv.length(), sval);
                        if (result2)
                        {
                            return *context.create_json(sval);
                        }
                        const jsoncons::detail::chars_to to_double;
                        try
                        {
                            auto s = arg0.as_string();
                            double d = to_double(s.c_str(), s.length());
                            return *context.create_json(d);
                        }
                        catch (const std::exception&)
                        {
                            return context.null_value();
                        }
                    }
                    default:
                        return context.null_value();
                }
            }